

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O0

bool cmCMakeLanguageCommand
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
               cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  size_t startArg;
  pointer pbVar2;
  bool bVar3;
  reference pvVar4;
  cmMakefile *pcVar5;
  string *psVar6;
  cmGlobalGenerator *this;
  char *pcVar7;
  ulong uVar8;
  cmExecutionStatus *pcVar9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var11;
  string_view sVar12;
  bool local_aeb;
  bool local_8d9;
  allocator<char> local_849;
  string local_848;
  optional<(anonymous_namespace)::Defer> local_828;
  allocator<char> local_7d1;
  string local_7d0;
  string *local_7b0;
  string *callCommand;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  basic_string_view<char,_std::char_traits<char>_> local_758;
  basic_string_view<char,_std::char_traits<char>_> local_748;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_738;
  cmAlphaNum local_728;
  string_view local_6f8;
  string_view local_6e8;
  cmAlphaNum local_6d0;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  basic_string_view<char,_std::char_traits<char>_> local_608;
  basic_string_view<char,_std::char_traits<char>_> local_5f8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_5e8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  basic_string_view<char,_std::char_traits<char>_> local_538;
  basic_string_view<char,_std::char_traits<char>_> local_528;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_518;
  string_view local_508;
  string_view local_4f8;
  cmAlphaNum local_4e8;
  string_view local_4b8;
  string_view local_4a8;
  cmAlphaNum local_490;
  string local_460;
  string local_440;
  allocator<char> local_419;
  string local_418;
  undefined1 local_3f8 [8];
  string dir;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  basic_string_view<char,_std::char_traits<char>_> local_388;
  basic_string_view<char,_std::char_traits<char>_> local_378;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_368;
  string_view local_358;
  cmAlphaNum local_348;
  string_view local_318;
  string_view local_308;
  cmAlphaNum local_2f8;
  string local_2c8;
  basic_string_view<char,_std::char_traits<char>_> local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_298;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_288;
  basic_string_view<char,_std::char_traits<char>_> local_278;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_258;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1f8;
  undefined1 local_1e8 [8];
  Defer defer;
  string local_198;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_158;
  undefined1 local_148 [8];
  optional<(anonymous_namespace)::Defer> maybeDefer;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_90 [8];
  anon_class_32_4_cfdc72da finishArgs;
  anon_class_40_5_733c87e0 moreArgs;
  size_t expArg;
  size_t rawArg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expArgs;
  cmExecutionStatus *status_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  
  expArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)status;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&rawArg);
  expArg = 0;
  moreArgs.status = (cmExecutionStatus *)0x0;
  finishArgs.expArgs =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&moreArgs.status;
  finishArgs.args = (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&expArg;
  moreArgs.args =
       (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
       expArgs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  finishArgs.rawArg =
       (size_t *)
       expArgs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_90 = (undefined1  [8])args;
  finishArgs.status = (cmExecutionStatus *)&rawArg;
  moreArgs.expArg = &rawArg;
  moreArgs.expArgs =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)finishArgs.args;
  moreArgs.rawArg = (size_t *)args;
  bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()
                    ((anon_class_40_5_733c87e0 *)&finishArgs.expArgs);
  pbVar2 = expArgs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"called with incorrect number of arguments",&local_c1);
    args_local._7_1_ = anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    goto LAB_0035d023;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&rawArg,(size_type)moreArgs.status);
  _Var11 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
  bVar10 = (basic_string_view<char,_std::char_traits<char>_>)
           cm::operator____s("SET_DEPENDENCY_PROVIDER",0x17);
  maybeDefer.super__Optional_base<(anonymous_namespace)::Defer,_false,_false>._M_payload.
  super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
  super__Optional_payload_base<(anonymous_namespace)::Defer>._72_8_ = bVar10._M_len;
  bVar3 = std::operator==(_Var11,bVar10);
  if (bVar3) {
    cmCMakeLanguageCommand::anon_class_32_4_cfdc72da::operator()
              ((anon_class_32_4_cfdc72da *)local_90);
    args_local._7_1_ =
         anon_unknown.dwarf_3df011::cmCMakeLanguageCommandSET_DEPENDENCY_PROVIDER
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&rawArg,
                    (cmExecutionStatus *)
                    expArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    goto LAB_0035d023;
  }
  std::optional<(anonymous_namespace)::Defer>::optional
            ((optional<(anonymous_namespace)::Defer> *)local_148);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&rawArg,(size_type)moreArgs.status);
  local_158 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
  local_178 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("DEFER",5);
  local_168 = local_178;
  bVar3 = std::operator==(local_158,local_178);
  if (bVar3) {
    moreArgs.status = (cmExecutionStatus *)((long)&(moreArgs.status)->Makefile + 1);
    bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()
                      ((anon_class_40_5_733c87e0 *)&finishArgs.expArgs);
    pbVar2 = expArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (bVar3) {
      anon_unknown.dwarf_3df011::Defer::Defer((Defer *)local_1e8);
LAB_0035b586:
      do {
        bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()
                          ((anon_class_40_5_733c87e0 *)&finishArgs.expArgs);
        if (!bVar3) {
LAB_0035c9ab:
          bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()
                            ((anon_class_40_5_733c87e0 *)&finishArgs.expArgs);
          local_aeb = false;
          if (bVar3) {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&rawArg,(size_type)moreArgs.status);
            local_738 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                        std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
            local_758 = (basic_string_view<char,_std::char_traits<char>_>)
                        cm::operator____s("CALL",4);
            local_748 = local_758;
            local_aeb = std::operator==(local_738,local_758);
          }
          pbVar2 = expArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (((local_aeb ^ 0xffU) & 1) == 0) {
            std::optional<(anonymous_namespace)::Defer>::operator=
                      ((optional<(anonymous_namespace)::Defer> *)local_148,(Defer *)local_1e8);
            bVar3 = false;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_778,"DEFER must be followed by a CALL argument",&local_779);
            args_local._7_1_ =
                 anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_778);
            std::__cxx11::string::~string((string *)&local_778);
            std::allocator<char>::~allocator(&local_779);
            bVar3 = true;
          }
          break;
        }
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&rawArg,(size_type)moreArgs.status);
        _Var11 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
        local_1f8 = _Var11;
        bVar10 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("CALL",4);
        local_218 = bVar10;
        local_208 = bVar10;
        bVar3 = std::operator==(local_1f8,bVar10);
        if (bVar3) goto LAB_0035c9ab;
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&rawArg,(size_type)moreArgs.status);
        _Var11 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
        local_228 = _Var11;
        bVar10 = (basic_string_view<char,_std::char_traits<char>_>)
                 cm::operator____s("CANCEL_CALL",0xb);
        local_248 = bVar10;
        local_238 = bVar10;
        bVar3 = std::operator==(local_228,bVar10);
        local_8d9 = true;
        if (!bVar3) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&rawArg,(size_type)moreArgs.status);
          _Var11 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
          local_258 = _Var11;
          bVar10 = (basic_string_view<char,_std::char_traits<char>_>)
                   cm::operator____s("GET_CALL_IDS",0xc);
          local_278 = bVar10;
          local_268 = bVar10;
          bVar3 = std::operator==(local_258,bVar10);
          local_8d9 = true;
          if (!bVar3) {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&rawArg,(size_type)moreArgs.status);
            _Var11 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
            local_288 = _Var11;
            bVar10 = (basic_string_view<char,_std::char_traits<char>_>)
                     cm::operator____s("GET_CALL",8);
            local_2a8 = bVar10;
            local_298 = bVar10;
            local_8d9 = std::operator==(local_288,bVar10);
          }
        }
        if (local_8d9 != false) {
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) != 0) {
            uVar8 = std::__cxx11::string::empty();
            if ((uVar8 & 1) != 0) {
              cmCMakeLanguageCommand::anon_class_32_4_cfdc72da::operator()
                        ((anon_class_32_4_cfdc72da *)local_90);
              args_local._7_1_ =
                   anon_unknown.dwarf_3df011::cmCMakeLanguageCommandDEFER
                             ((Defer *)local_1e8,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&rawArg,(size_t)moreArgs.status,
                              (cmExecutionStatus *)
                              expArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              bVar3 = true;
              break;
            }
          }
          pbVar2 = expArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_318 = (string_view)cm::operator____s("DEFER ",6);
          local_308 = local_318;
          cmAlphaNum::cmAlphaNum(&local_2f8,local_318);
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&rawArg,(size_type)moreArgs.status);
          cmAlphaNum::cmAlphaNum(&local_348,pvVar4);
          local_358 = (string_view)cm::operator____s(" does not accept ID or ID_VAR.",0x1e);
          cmStrCat<cm::static_string_view>
                    (&local_2c8,&local_2f8,&local_348,(static_string_view *)&local_358);
          args_local._7_1_ =
               anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_2c8);
          std::__cxx11::string::~string((string *)&local_2c8);
          bVar3 = true;
          break;
        }
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&rawArg,(size_type)moreArgs.status);
        _Var11 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
        local_368 = _Var11;
        bVar10 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("DIRECTORY",9);
        local_388 = bVar10;
        local_378 = bVar10;
        bVar3 = std::operator==(local_368,bVar10);
        pbVar2 = expArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (!bVar3) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&rawArg,(size_type)moreArgs.status);
          _Var11 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
          local_518 = _Var11;
          bVar10 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("ID",2);
          local_538 = bVar10;
          local_528 = bVar10;
          bVar3 = std::operator==(local_518,bVar10);
          if (bVar3) {
            moreArgs.status = (cmExecutionStatus *)((long)&(moreArgs.status)->Makefile + 1);
            uVar8 = std::__cxx11::string::empty();
            pbVar2 = expArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if ((uVar8 & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_558,"DEFER given multiple ID arguments",&local_559);
              args_local._7_1_ =
                   anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_558);
              std::__cxx11::string::~string((string *)&local_558);
              std::allocator<char>::~allocator(&local_559);
              bVar3 = true;
              break;
            }
            bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()
                              ((anon_class_40_5_733c87e0 *)&finishArgs.expArgs);
            pbVar2 = expArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pcVar1 = moreArgs.status;
            if (!bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_580,"DEFER ID missing value",&local_581);
              args_local._7_1_ =
                   anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_580);
              std::__cxx11::string::~string((string *)&local_580);
              std::allocator<char>::~allocator(&local_581);
              bVar3 = true;
              break;
            }
            moreArgs.status = (cmExecutionStatus *)((long)&(moreArgs.status)->Makefile + 1);
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&rawArg,(size_type)pcVar1);
            std::__cxx11::string::operator=((string *)local_1e8,(string *)pvVar4);
            uVar8 = std::__cxx11::string::empty();
            pbVar2 = expArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if ((uVar8 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_5a8,"DEFER ID may not be empty",&local_5a9);
              args_local._7_1_ =
                   anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_5a8);
              std::__cxx11::string::~string((string *)&local_5a8);
              std::allocator<char>::~allocator(&local_5a9);
              bVar3 = true;
              break;
            }
            pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_1e8);
            if ('@' < *pcVar7) {
              pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_1e8);
              pbVar2 = expArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              if (*pcVar7 < '[') {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5d0,"DEFER ID may not start in A-Z.",&local_5d1);
                args_local._7_1_ =
                     anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_5d0);
                std::__cxx11::string::~string((string *)&local_5d0);
                std::allocator<char>::~allocator(&local_5d1);
                bVar3 = true;
                break;
              }
            }
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&rawArg,(size_type)moreArgs.status);
            _Var11 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar4);
            local_5e8 = _Var11;
            bVar10 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("ID_VAR",6)
            ;
            local_608 = bVar10;
            local_5f8 = bVar10;
            bVar3 = std::operator==(local_5e8,bVar10);
            pbVar2 = expArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (!bVar3) {
              local_6f8 = (string_view)cm::operator____s("DEFER unknown option:\n  ",0x18);
              local_6e8 = local_6f8;
              cmAlphaNum::cmAlphaNum(&local_6d0,local_6f8);
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&rawArg,(size_type)moreArgs.status);
              cmAlphaNum::cmAlphaNum(&local_728,pvVar4);
              cmStrCat<>(&local_6a0,&local_6d0,&local_728);
              args_local._7_1_ =
                   anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_6a0);
              std::__cxx11::string::~string((string *)&local_6a0);
              bVar3 = true;
              break;
            }
            moreArgs.status = (cmExecutionStatus *)((long)&(moreArgs.status)->Makefile + 1);
            uVar8 = std::__cxx11::string::empty();
            pbVar2 = expArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if ((uVar8 & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_628,"DEFER given multiple ID_VAR arguments",&local_629);
              args_local._7_1_ =
                   anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_628);
              std::__cxx11::string::~string((string *)&local_628);
              std::allocator<char>::~allocator(&local_629);
              bVar3 = true;
              break;
            }
            bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()
                              ((anon_class_40_5_733c87e0 *)&finishArgs.expArgs);
            pbVar2 = expArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pcVar1 = moreArgs.status;
            if (!bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_650,"DEFER ID_VAR missing variable name",&local_651);
              args_local._7_1_ =
                   anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_650);
              std::__cxx11::string::~string((string *)&local_650);
              std::allocator<char>::~allocator(&local_651);
              bVar3 = true;
              break;
            }
            moreArgs.status = (cmExecutionStatus *)((long)&(moreArgs.status)->Makefile + 1);
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&rawArg,(size_type)pcVar1);
            std::__cxx11::string::operator=
                      ((string *)(defer.Id.field_2._M_local_buf + 8),(string *)pvVar4);
            uVar8 = std::__cxx11::string::empty();
            pbVar2 = expArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if ((uVar8 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_678,"DEFER ID_VAR may not be empty",&local_679);
              args_local._7_1_ =
                   anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_678);
              std::__cxx11::string::~string((string *)&local_678);
              std::allocator<char>::~allocator(&local_679);
              bVar3 = true;
              break;
            }
          }
          goto LAB_0035b586;
        }
        moreArgs.status = (cmExecutionStatus *)((long)&(moreArgs.status)->Makefile + 1);
        if (defer.IdVar.field_2._8_8_ != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a8,"DEFER given multiple DIRECTORY arguments",&local_3a9);
          args_local._7_1_ =
               anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_3a8);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::allocator<char>::~allocator(&local_3a9);
          bVar3 = true;
          break;
        }
        bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()
                          ((anon_class_40_5_733c87e0 *)&finishArgs.expArgs);
        pbVar2 = expArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pcVar1 = moreArgs.status;
        if (!bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d0,"DEFER DIRECTORY missing value",
                     (allocator<char> *)(dir.field_2._M_local_buf + 0xf));
          args_local._7_1_ =
               anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_3d0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xf));
          bVar3 = true;
          break;
        }
        moreArgs.status = (cmExecutionStatus *)((long)&(moreArgs.status)->Makefile + 1);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&rawArg,(size_type)pcVar1);
        std::__cxx11::string::string((string *)local_3f8,(string *)pvVar4);
        uVar8 = std::__cxx11::string::empty();
        pbVar2 = expArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((uVar8 & 1) == 0) {
          pcVar5 = cmExecutionStatus::GetMakefile
                             ((cmExecutionStatus *)
                              expArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar5);
          cmsys::SystemTools::CollapseFullPath(&local_440,(string *)local_3f8,psVar6);
          std::__cxx11::string::operator=((string *)local_3f8,(string *)&local_440);
          std::__cxx11::string::~string((string *)&local_440);
          pcVar5 = cmExecutionStatus::GetMakefile
                             ((cmExecutionStatus *)
                              expArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          this = cmMakefile::GetGlobalGenerator(pcVar5);
          defer.IdVar.field_2._8_8_ = cmGlobalGenerator::FindMakefile(this,(string *)local_3f8);
          pbVar2 = expArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((cmMakefile *)defer.IdVar.field_2._8_8_ == (cmMakefile *)0x0) {
            sVar12 = (string_view)cm::operator____s("DEFER DIRECTORY:\n  ",0x13);
            local_4b8 = sVar12;
            local_4a8 = sVar12;
            cmAlphaNum::cmAlphaNum(&local_490,sVar12);
            cmAlphaNum::cmAlphaNum(&local_4e8,(string *)local_3f8);
            sVar12 = (string_view)cm::operator____s("\nis not known.  ",0x10);
            local_4f8 = sVar12;
            sVar12 = (string_view)cm::operator____s("It may not have been processed yet.",0x23);
            local_508 = sVar12;
            cmStrCat<cm::static_string_view,cm::static_string_view>
                      (&local_460,&local_490,&local_4e8,(static_string_view *)&local_4f8,
                       (static_string_view *)&local_508);
            args_local._7_1_ =
                 anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_460);
            std::__cxx11::string::~string((string *)&local_460);
            bVar3 = true;
          }
          else {
            bVar3 = false;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_418,"DEFER DIRECTORY may not be empty",&local_419);
          args_local._7_1_ =
               anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_418);
          std::__cxx11::string::~string((string *)&local_418);
          std::allocator<char>::~allocator(&local_419);
          bVar3 = true;
        }
        std::__cxx11::string::~string((string *)local_3f8);
      } while (!bVar3);
      anon_unknown.dwarf_3df011::Defer::~Defer((Defer *)local_1e8);
      if (!bVar3) goto LAB_0035cb98;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"DEFER requires at least one argument",
                 (allocator<char> *)((long)&defer.Directory + 7));
      args_local._7_1_ =
           anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)((long)&defer.Directory + 7));
    }
  }
  else {
LAB_0035cb98:
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&rawArg,(size_type)moreArgs.status);
    bVar3 = std::operator==(pvVar4,"CALL");
    if (bVar3) {
      moreArgs.status = (cmExecutionStatus *)((long)&(moreArgs.status)->Makefile + 1);
      bVar3 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()
                        ((anon_class_40_5_733c87e0 *)&finishArgs.expArgs);
      pbVar2 = expArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pcVar1 = moreArgs.status;
      if (bVar3) {
        moreArgs.status = (cmExecutionStatus *)((long)&(moreArgs.status)->Makefile + 1);
        local_7b0 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&rawArg,(size_type)pcVar1);
        pcVar1 = moreArgs.status;
        pcVar9 = (cmExecutionStatus *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&rawArg);
        pbVar2 = expArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        startArg = expArg;
        psVar6 = local_7b0;
        if (pcVar1 == pcVar9) {
          std::optional<(anonymous_namespace)::Defer>::optional
                    (&local_828,(optional<(anonymous_namespace)::Defer> *)local_148);
          args_local._7_1_ =
               anon_unknown.dwarf_3df011::cmCMakeLanguageCommandCALL
                         (args,psVar6,startArg,&local_828,
                          (cmExecutionStatus *)
                          expArgs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::optional<(anonymous_namespace)::Defer>::~optional(&local_828);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7d0,"CALL command\'s arguments must be literal",&local_7d1);
          args_local._7_1_ =
               anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_7d0);
          std::__cxx11::string::~string((string *)&local_7d0);
          std::allocator<char>::~allocator(&local_7d1);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7a0,"CALL missing command name",
                   (allocator<char> *)((long)&callCommand + 7));
        args_local._7_1_ =
             anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_7a0);
        std::__cxx11::string::~string((string *)&local_7a0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&callCommand + 7));
      }
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&rawArg,(size_type)moreArgs.status);
      bVar3 = std::operator==(pvVar4,"EVAL");
      if (bVar3) {
        args_local._7_1_ =
             anon_unknown.dwarf_3df011::cmCMakeLanguageCommandEVAL
                       (args,(cmExecutionStatus *)
                             expArgs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&rawArg,(size_type)moreArgs.status);
        bVar3 = std::operator==(pvVar4,"GET_MESSAGE_LOG_LEVEL");
        pbVar2 = expArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (bVar3) {
          args_local._7_1_ =
               anon_unknown.dwarf_3df011::cmCMakeLanguageCommandGET_MESSAGE_LOG_LEVEL
                         (args,(cmExecutionStatus *)
                               expArgs.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_848,"called with unknown meta-operation",&local_849);
          args_local._7_1_ =
               anon_unknown.dwarf_3df011::FatalError((cmExecutionStatus *)pbVar2,&local_848);
          std::__cxx11::string::~string((string *)&local_848);
          std::allocator<char>::~allocator(&local_849);
        }
      }
    }
  }
  std::optional<(anonymous_namespace)::Defer>::~optional
            ((optional<(anonymous_namespace)::Defer> *)local_148);
LAB_0035d023:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&rawArg);
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmCMakeLanguageCommand(std::vector<cmListFileArgument> const& args,
                            cmExecutionStatus& status)
{
  std::vector<std::string> expArgs;
  size_t rawArg = 0;
  size_t expArg = 0;

  // Helper to consume and expand one raw argument at a time.
  auto moreArgs = [&]() -> bool {
    while (expArg >= expArgs.size()) {
      if (rawArg >= args.size()) {
        return false;
      }
      std::vector<cmListFileArgument> tmpArg;
      tmpArg.emplace_back(args[rawArg++]);
      status.GetMakefile().ExpandArguments(tmpArg, expArgs);
    }
    return true;
  };
  auto finishArgs = [&]() {
    std::vector<cmListFileArgument> tmpArgs(args.begin() + rawArg, args.end());
    status.GetMakefile().ExpandArguments(tmpArgs, expArgs);
    rawArg = args.size();
  };

  if (!moreArgs()) {
    return FatalError(status, "called with incorrect number of arguments");
  }

  if (expArgs[expArg] == "SET_DEPENDENCY_PROVIDER"_s) {
    finishArgs();
    return cmCMakeLanguageCommandSET_DEPENDENCY_PROVIDER(expArgs, status);
  }

  cm::optional<Defer> maybeDefer;
  if (expArgs[expArg] == "DEFER"_s) {
    ++expArg; // Consume "DEFER".

    if (!moreArgs()) {
      return FatalError(status, "DEFER requires at least one argument");
    }

    Defer defer;

    // Process optional arguments.
    while (moreArgs()) {
      if (expArgs[expArg] == "CALL"_s) {
        break;
      }
      if (expArgs[expArg] == "CANCEL_CALL"_s ||
          expArgs[expArg] == "GET_CALL_IDS"_s ||
          expArgs[expArg] == "GET_CALL"_s) {
        if (!defer.Id.empty() || !defer.IdVar.empty()) {
          return FatalError(status,
                            cmStrCat("DEFER "_s, expArgs[expArg],
                                     " does not accept ID or ID_VAR."_s));
        }
        finishArgs();
        return cmCMakeLanguageCommandDEFER(defer, expArgs, expArg, status);
      }
      if (expArgs[expArg] == "DIRECTORY"_s) {
        ++expArg; // Consume "DIRECTORY".
        if (defer.Directory) {
          return FatalError(status,
                            "DEFER given multiple DIRECTORY arguments");
        }
        if (!moreArgs()) {
          return FatalError(status, "DEFER DIRECTORY missing value");
        }
        std::string dir = expArgs[expArg++];
        if (dir.empty()) {
          return FatalError(status, "DEFER DIRECTORY may not be empty");
        }
        dir = cmSystemTools::CollapseFullPath(
          dir, status.GetMakefile().GetCurrentSourceDirectory());
        defer.Directory =
          status.GetMakefile().GetGlobalGenerator()->FindMakefile(dir);
        if (!defer.Directory) {
          return FatalError(status,
                            cmStrCat("DEFER DIRECTORY:\n  "_s, dir,
                                     "\nis not known.  "_s,
                                     "It may not have been processed yet."_s));
        }
      } else if (expArgs[expArg] == "ID"_s) {
        ++expArg; // Consume "ID".
        if (!defer.Id.empty()) {
          return FatalError(status, "DEFER given multiple ID arguments");
        }
        if (!moreArgs()) {
          return FatalError(status, "DEFER ID missing value");
        }
        defer.Id = expArgs[expArg++];
        if (defer.Id.empty()) {
          return FatalError(status, "DEFER ID may not be empty");
        }
        if (defer.Id[0] >= 'A' && defer.Id[0] <= 'Z') {
          return FatalError(status, "DEFER ID may not start in A-Z.");
        }
      } else if (expArgs[expArg] == "ID_VAR"_s) {
        ++expArg; // Consume "ID_VAR".
        if (!defer.IdVar.empty()) {
          return FatalError(status, "DEFER given multiple ID_VAR arguments");
        }
        if (!moreArgs()) {
          return FatalError(status, "DEFER ID_VAR missing variable name");
        }
        defer.IdVar = expArgs[expArg++];
        if (defer.IdVar.empty()) {
          return FatalError(status, "DEFER ID_VAR may not be empty");
        }
      } else {
        return FatalError(
          status, cmStrCat("DEFER unknown option:\n  "_s, expArgs[expArg]));
      }
    }

    if (!(moreArgs() && expArgs[expArg] == "CALL"_s)) {
      return FatalError(status, "DEFER must be followed by a CALL argument");
    }

    maybeDefer = std::move(defer);
  }

  if (expArgs[expArg] == "CALL") {
    ++expArg; // Consume "CALL".

    // CALL requires a command name.
    if (!moreArgs()) {
      return FatalError(status, "CALL missing command name");
    }
    std::string const& callCommand = expArgs[expArg++];

    // CALL accepts no further expanded arguments.
    if (expArg != expArgs.size()) {
      return FatalError(status, "CALL command's arguments must be literal");
    }

    // Run the CALL.
    return cmCMakeLanguageCommandCALL(args, callCommand, rawArg,
                                      std::move(maybeDefer), status);
  }

  if (expArgs[expArg] == "EVAL") {
    return cmCMakeLanguageCommandEVAL(args, status);
  }

  if (expArgs[expArg] == "GET_MESSAGE_LOG_LEVEL") {
    return cmCMakeLanguageCommandGET_MESSAGE_LOG_LEVEL(args, status);
  }

  return FatalError(status, "called with unknown meta-operation");
}